

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.c
# Opt level: O0

int * int32Calloc(int n)

{
  int *piVar1;
  char local_128 [8];
  char msg [256];
  int local_1c;
  int i;
  int *buf;
  int n_local;
  
  piVar1 = (int *)superlu_malloc((long)n << 2);
  if (piVar1 == (int *)0x0) {
    sprintf(local_128,"%s at line %d in file %s\n","SUPERLU_MALLOC fails for buf in intCalloc()",
            0xad,"/workspace/llm4binary/github/license_c_cmakelists/xiaoyeli[P]superlu/SRC/memory.c"
           );
    superlu_abort_and_exit(local_128);
  }
  for (local_1c = 0; local_1c < n; local_1c = local_1c + 1) {
    piVar1[local_1c] = 0;
  }
  return piVar1;
}

Assistant:

int *int32Calloc(int n)
{
    int *buf;
    register int i;
    buf = (int *) SUPERLU_MALLOC(n * sizeof(int));
    if ( !buf ) {
	ABORT("SUPERLU_MALLOC fails for buf in intCalloc()");
    }
    for (i = 0; i < n; ++i) buf[i] = 0;
    return (buf);
}